

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Emu.cpp
# Opt level: O0

int kss_cpu_in(Kss_Cpu *param_1,cpu_time_t param_2,uint addr)

{
  uint addr_local;
  cpu_time_t param_1_local;
  Kss_Cpu *param_0_local;
  
  return 0;
}

Assistant:

int kss_cpu_in( Kss_Cpu*, cpu_time_t, unsigned addr )
{
	//Kss_Emu& emu = STATIC_CAST(Kss_Emu&,*cpu);
	//switch ( addr & 0xFF )
	//{
	//}
	
	debug_printf( "IN $%04X\n", addr );
	return 0;
}